

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

QMetaMethodBuilderPrivate * __thiscall
QMetaMethodBuilderPrivate::operator=
          (QMetaMethodBuilderPrivate *this,QMetaMethodBuilderPrivate *param_1)

{
  int iVar1;
  
  QArrayDataPointer<char>::swap((QArrayDataPointer<char> *)this,(QArrayDataPointer<char> *)param_1);
  QArrayDataPointer<char>::swap(&(this->returnType).d,&(param_1->returnType).d);
  QArrayDataPointer<QByteArray>::operator=(&(this->parameterNames).d,&(param_1->parameterNames).d);
  QArrayDataPointer<char>::swap(&(this->tag).d,&(param_1->tag).d);
  iVar1 = param_1->revision;
  this->attributes = param_1->attributes;
  this->revision = iVar1;
  return this;
}

Assistant:

QMetaMethodBuilderPrivate
            (QMetaMethod::MethodType _methodType,
             const QByteArray& _signature,
             const QByteArray& _returnType = QByteArray("void"),
             QMetaMethod::Access _access = QMetaMethod::Public,
             int _revision = 0)
        : signature(QMetaObject::normalizedSignature(_signature.constData())),
          returnType(QMetaObject::normalizedType(_returnType)),
          attributes(((int)_access) | (((int)_methodType) << 2)),
          revision(_revision)
    {
        Q_ASSERT((_methodType == QMetaMethod::Constructor) == returnType.isNull());
    }